

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::ExtensionRangeOptions::ByteSizeLong(ExtensionRangeOptions *this)

{
  bool bVar1;
  int iVar2;
  reference value;
  size_t sVar3;
  UninterpretedOption *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  ExtensionRangeOptions *this_local;
  
  sStack_18 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar2 = _internal_uninterpreted_option_size(this);
  sStack_18 = (long)iVar2 * 2 + sStack_18;
  __end2 = RepeatedPtrField<google::protobuf::UninterpretedOption>::begin
                     (&this->uninterpreted_option_);
  msg = (UninterpretedOption *)
        RepeatedPtrField<google::protobuf::UninterpretedOption>::end(&this->uninterpreted_option_);
  while( true ) {
    bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator!=
                      (&__end2,(iterator *)&msg);
    if (!bVar1) break;
    value = internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator*
                      (&__end2);
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>(value);
    sStack_18 = sVar3 + sStack_18;
    internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator++(&__end2);
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_18,&this->_cached_size_);
  return sVar3;
}

Assistant:

size_t ExtensionRangeOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.ExtensionRangeOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2UL * this->_internal_uninterpreted_option_size();
  for (const auto& msg : this->uninterpreted_option_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}